

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O2

void __thiscall FIX::HttpConnection::processRequest(HttpConnection *this,HttpMessage *request)

{
  bool bVar1;
  TAG *pTVar2;
  stringstream *in_RCX;
  stringstream *h_00;
  void *__buf;
  int error;
  HttpConnection *pHVar3;
  int in_R8D;
  string titleString;
  TITLE title;
  string response;
  stringstream b;
  stringstream h;
  BODY body;
  string sStack_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  TAG local_858;
  TAG local_6a0;
  stringstream local_4e8 [16];
  ostream local_4d8 [376];
  stringstream local_360 [16];
  ostream local_350 [376];
  TAG local_1d8;
  
  std::__cxx11::stringstream::stringstream(local_360);
  std::__cxx11::stringstream::stringstream(local_4e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_898,"QuickFIX Engine Web Interface",(allocator<char> *)&local_1d8);
  HTML::HEAD::HEAD((HEAD *)&local_1d8,local_350);
  HTML::TAG::text(&local_1d8);
  HTML::CENTER::CENTER((CENTER *)&local_6a0,local_350);
  HTML::TAG::text(&local_6a0);
  HTML::TITLE::TITLE((TITLE *)&local_858,local_350);
  HTML::TAG::text<std::__cxx11::string>(&local_858,&local_898);
  HTML::TAG::~TAG(&local_858);
  HTML::H1::H1((H1 *)&local_858,local_350);
  HTML::TAG::text<std::__cxx11::string>(&local_858,&local_898);
  HTML::TAG::~TAG(&local_858);
  HTML::TAG::~TAG(&local_6a0);
  HTML::CENTER::CENTER((CENTER *)&local_6a0,local_350);
  HTML::TAG::text(&local_6a0);
  HTML::A::A((A *)&local_858,local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_8d8,"/",(allocator<char> *)&local_8b8);
  pTVar2 = &HTML::A::href((A *)&local_858,&sStack_8d8)->super_TAG;
  HTML::TAG::text<char[5]>(pTVar2,(char (*) [5])"HOME");
  std::__cxx11::string::~string((string *)&sStack_8d8);
  HTML::TAG::~TAG(&local_858);
  std::operator<<(local_350,HTML::NBSP);
  HTML::A::A((A *)&local_858,local_350);
  HttpMessage::toString_abi_cxx11_(&sStack_8d8,request);
  pTVar2 = &HTML::A::href((A *)&local_858,&sStack_8d8)->super_TAG;
  HTML::TAG::text<char[7]>(pTVar2,(char (*) [7])"RELOAD");
  std::__cxx11::string::~string((string *)&sStack_8d8);
  HTML::TAG::~TAG(&local_858);
  HTML::TAG::~TAG(&local_6a0);
  HTML::HR::HR((HR *)&local_6a0,local_350);
  HTML::TAG::text(&local_6a0);
  HTML::TAG::~TAG(&local_6a0);
  HTML::TAG::~TAG(&local_1d8);
  HTML::BODY::BODY((BODY *)&local_1d8,local_4d8);
  HTML::TAG::text(&local_1d8);
  pHVar3 = (HttpConnection *)request;
  bVar1 = std::operator==(&request->m_root,"/");
  if (bVar1) {
    in_RCX = (stringstream *)local_4e8;
    processRoot(pHVar3,request,h_00,in_RCX);
  }
  else {
    pHVar3 = (HttpConnection *)request;
    bVar1 = std::operator==(&request->m_root,"/resetSessions");
    if (bVar1) {
      in_RCX = (stringstream *)local_4e8;
      processResetSessions(pHVar3,request,(stringstream *)local_360,in_RCX);
    }
    else {
      pHVar3 = (HttpConnection *)request;
      bVar1 = std::operator==(&request->m_root,"/refreshSessions");
      if (bVar1) {
        in_RCX = (stringstream *)local_4e8;
        processRefreshSessions(pHVar3,request,(stringstream *)local_360,in_RCX);
      }
      else {
        pHVar3 = (HttpConnection *)request;
        bVar1 = std::operator==(&request->m_root,"/enableSessions");
        if (bVar1) {
          in_RCX = (stringstream *)local_4e8;
          processEnableSessions(pHVar3,request,(stringstream *)local_360,in_RCX);
        }
        else {
          pHVar3 = (HttpConnection *)request;
          bVar1 = std::operator==(&request->m_root,"/disableSessions");
          if (bVar1) {
            in_RCX = (stringstream *)local_4e8;
            processDisableSessions(pHVar3,request,(stringstream *)local_360,in_RCX);
          }
          else {
            bVar1 = std::operator==(&request->m_root,"/session");
            if (bVar1) {
              in_RCX = (stringstream *)local_4e8;
              processSession(this,request,(stringstream *)local_360,in_RCX);
            }
            else {
              pHVar3 = (HttpConnection *)request;
              bVar1 = std::operator==(&request->m_root,"/resetSession");
              if (bVar1) {
                in_RCX = (stringstream *)local_4e8;
                processResetSession(pHVar3,request,(stringstream *)local_360,in_RCX);
              }
              else {
                pHVar3 = (HttpConnection *)request;
                bVar1 = std::operator==(&request->m_root,"/refreshSession");
                if (!bVar1) {
                  error = 0x194;
                  bVar1 = false;
                  goto LAB_0018b036;
                }
                in_RCX = (stringstream *)local_4e8;
                processRefreshSession(pHVar3,request,(stringstream *)local_360,in_RCX);
              }
            }
          }
        }
      }
    }
  }
  error = 200;
  bVar1 = true;
LAB_0018b036:
  std::__cxx11::stringbuf::str();
  std::operator+(&sStack_8d8,"<HTML>",&local_8b8);
  std::__cxx11::stringbuf::str();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_858,
                 &sStack_8d8,&local_878);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_858,
                 "</HTML>");
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&sStack_8d8);
  std::__cxx11::string::~string((string *)&local_8b8);
  if (bVar1) {
    std::__cxx11::string::string((string *)&sStack_8d8,(string *)&local_6a0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_8d8,"",(allocator<char> *)&local_8b8);
  }
  HttpMessage::createResponse((string *)&local_858,error,&sStack_8d8);
  send(this,(int)&local_858,__buf,(size_t)in_RCX,in_R8D);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&sStack_8d8);
  disconnect(this,0);
  std::__cxx11::string::~string((string *)&local_6a0);
  HTML::TAG::~TAG(&local_1d8);
  std::__cxx11::string::~string((string *)&local_898);
  std::__cxx11::stringstream::~stringstream(local_4e8);
  std::__cxx11::stringstream::~stringstream(local_360);
  return;
}

Assistant:

void HttpConnection::processRequest(const HttpMessage &request) {
  int error = 200;
  std::stringstream h;
  std::stringstream b;
  std::string titleString = "QuickFIX Engine Web Interface";

  {
    HEAD head(h);
    head.text();
    {
      CENTER center(h);
      center.text();
      {
        TITLE title(h);
        title.text(titleString);
      }
      {
        H1 h1(h);
        h1.text(titleString);
      }
    }
    {
      CENTER center(h);
      center.text();
      {
        A a(h);
        a.href("/").text("HOME");
      }
      h << NBSP;
      {
        A a(h);
        a.href(request.toString()).text("RELOAD");
      }
    }
    HR hr(h);
    hr.text();
  }

  BODY body(b);
  body.text();

  try {
    if (request.getRootString() == "/") {
      processRoot(request, h, b);
    } else if (request.getRootString() == "/resetSessions") {
      processResetSessions(request, h, b);
    } else if (request.getRootString() == "/refreshSessions") {
      processRefreshSessions(request, h, b);
    } else if (request.getRootString() == "/enableSessions") {
      processEnableSessions(request, h, b);
    } else if (request.getRootString() == "/disableSessions") {
      processDisableSessions(request, h, b);
    } else if (request.getRootString() == "/session") {
      processSession(request, h, b);
    } else if (request.getRootString() == "/resetSession") {
      processResetSession(request, h, b);
    } else if (request.getRootString() == "/refreshSession") {
      processRefreshSession(request, h, b);
    } else {
      error = 404;
    }
  } catch (std::exception &e) {
    error = 400;
    b << e.what();
  }

  std::string response = "<HTML>" + h.str() + b.str() + "</HTML>";
  send(HttpMessage::createResponse(error, error == 200 ? response : ""));

  disconnect();
}